

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_upkeep(Curl_easy *data)

{
  CURLcode CVar1;
  
  CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    CVar1 = CURLE_OK;
    if (data->multi_easy != (Curl_multi *)0x0) {
      Curl_conncache_foreach(data,&data->multi_easy->conn_cache,data,conn_upkeep);
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_easy_upkeep(struct Curl_easy *data)
{
  /* Verify that we got an easy handle we can work with. */
  if(!GOOD_EASY_HANDLE(data))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi_easy) {
    /* Use the common function to keep connections alive. */
    return upkeep(&data->multi_easy->conn_cache, data);
  }
  else {
    /* No connections, so just return success */
    return CURLE_OK;
  }
}